

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,PatternCaseStatement *stmt)

{
  bool bVar1;
  int iVar2;
  reference pIVar3;
  long in_RSI;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_RDI;
  ItemGroup *item;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL> *__range3;
  int finalState;
  type_conflict1 initialState;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_stack_ffffffffffffffa0;
  span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>
  *in_stack_ffffffffffffffa8;
  Expression *in_stack_ffffffffffffffb0;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
  local_28;
  long local_20;
  int local_18;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  visit<slang::ast::Expression>(in_stack_ffffffffffffffa0,(Expression *)in_RDI);
  local_14 = in_RDI->state;
  local_18 = TestAnalysis::unreachableState((TestAnalysis *)in_RDI);
  local_20 = local_10 + 0x28;
  local_28._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL> *
                  )in_RDI);
  std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
             ::operator*(&local_28);
    iVar2 = TestAnalysis::copyState((TestAnalysis *)in_RDI,&local_14);
    setState(in_RDI,iVar2);
    not_null<const_slang::ast::Pattern_*>::operator*
              ((not_null<const_slang::ast::Pattern_*> *)0x24d014);
    visit<slang::ast::Pattern>(in_stack_ffffffffffffffa0,(Pattern *)in_RDI);
    if (pIVar3->filter != (Expression *)0x0) {
      visitCondition(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x24d04d);
      setState(in_RDI,in_RDI->stateWhenTrue);
    }
    not_null<const_slang::ast::Statement_*>::operator*
              ((not_null<const_slang::ast::Statement_*> *)0x24d06a);
    visit<slang::ast::Statement>(in_stack_ffffffffffffffa0,(Statement *)in_RDI);
    TestAnalysis::joinState((TestAnalysis *)in_RDI,&local_18,&in_RDI->state);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::PatternCaseStatement::ItemGroup_*,_std::span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_28);
  }
  if (*(long *)(local_10 + 0x38) == 0) {
    TestAnalysis::joinState((TestAnalysis *)in_RDI,&local_18,&local_14);
  }
  else {
    iVar2 = TestAnalysis::copyState((TestAnalysis *)in_RDI,&local_14);
    setState(in_RDI,iVar2);
    visit<slang::ast::Statement>(in_stack_ffffffffffffffa0,(Statement *)in_RDI);
    TestAnalysis::joinState((TestAnalysis *)in_RDI,&local_18,&in_RDI->state);
  }
  setState(in_RDI,local_18);
  return;
}

Assistant:

void visitStmt(const PatternCaseStatement& stmt) {
        // TODO: match handling for regular CaseStatements
        visit(stmt.expr);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            setState((DERIVED).copyState(initialState));

            visit(*item.pattern);

            if (item.filter) {
                visitCondition(*item.filter);
                setState(std::move(stateWhenTrue));
            }

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        if (stmt.defaultCase) {
            setState((DERIVED).copyState(initialState));
            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else {
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }